

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void __thiscall doctest::detail::ContextState::finalizeTestCaseData(ContextState *this)

{
  int *piVar1;
  uint *puVar2;
  uint uVar3;
  TestCase *pTVar4;
  int result_1;
  uint uVar5;
  long lVar6;
  int result;
  int iVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  timeval t;
  Approx local_48;
  Approx local_30;
  
  iVar7 = 0;
  gettimeofday((timeval *)&local_30,(__timezone_ptr_t)0x0);
  lVar6 = ((long)local_30.m_epsilon * 1000000 + (long)local_30.m_scale) - (this->timer).m_ticks;
  auVar11._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar11._0_8_ = lVar6;
  auVar11._12_4_ = 0x45300000;
  (this->super_CurrentTestCaseStats).seconds =
       ((auVar11._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) / 1000000.0;
  lVar6 = 0;
  do {
    iVar7 = iVar7 + *(int *)((this->numAssertsCurrentTest_atomic).m_atomics[0].padding + lVar6 + -4)
    ;
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0x800);
  piVar1 = &(this->super_TestRunStats).numAsserts;
  *piVar1 = *piVar1 + iVar7;
  iVar7 = 0;
  lVar6 = 0;
  do {
    iVar7 = iVar7 + *(int *)((this->numAssertsFailedCurrentTest_atomic).m_atomics[0].padding +
                            lVar6 + -4);
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0x800);
  piVar1 = &(this->super_TestRunStats).numAssertsFailed;
  *piVar1 = *piVar1 + iVar7;
  iVar7 = 0;
  lVar6 = 0;
  do {
    iVar7 = iVar7 + *(int *)((this->numAssertsCurrentTest_atomic).m_atomics[0].padding + lVar6 + -4)
    ;
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0x800);
  (this->super_CurrentTestCaseStats).numAssertsCurrentTest = iVar7;
  iVar7 = 0;
  lVar6 = 0;
  do {
    iVar7 = iVar7 + *(int *)((this->numAssertsFailedCurrentTest_atomic).m_atomics[0].padding +
                            lVar6 + -4);
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0x800);
  (this->super_CurrentTestCaseStats).numAssertsFailedCurrentTest = iVar7;
  if (iVar7 != 0) {
    piVar1 = &(this->super_CurrentTestCaseStats).failure_flags;
    *(byte *)piVar1 = (byte)*piVar1 | 1;
  }
  Approx::Approx(&local_30,
                 (((this->super_ContextOptions).currentTest)->super_TestCaseData).m_timeout);
  local_30.m_epsilon = 2.220446049250313e-16;
  dVar9 = ABS(local_30.m_value);
  if (dVar9 <= 0.0) {
    dVar9 = 0.0;
  }
  if ((dVar9 + local_30.m_scale) * 2.220446049250313e-16 <= ABS(0.0 - local_30.m_value)) {
    Approx::Approx(&local_48,(this->super_CurrentTestCaseStats).seconds);
    dVar9 = (((this->super_ContextOptions).currentTest)->super_TestCaseData).m_timeout;
    if (dVar9 < local_48.m_value) {
      dVar10 = ABS(local_48.m_value);
      if (ABS(local_48.m_value) <= ABS(dVar9)) {
        dVar10 = ABS(dVar9);
      }
      if ((dVar10 + local_48.m_scale) * 2.220446049250313e-16 <= ABS(dVar9 - local_48.m_value)) {
        piVar1 = &(this->super_CurrentTestCaseStats).failure_flags;
        *(byte *)piVar1 = (byte)*piVar1 | 0x10;
      }
    }
  }
  pTVar4 = (this->super_ContextOptions).currentTest;
  uVar3 = (this->super_CurrentTestCaseStats).failure_flags;
  if ((pTVar4->super_TestCaseData).m_should_fail == true) {
    uVar5 = 0x20;
    if (uVar3 != 0) {
      uVar5 = uVar3 | 0x40;
    }
  }
  else if ((uVar3 == 0) || ((pTVar4->super_TestCaseData).m_may_fail != true)) {
    iVar7 = (pTVar4->super_TestCaseData).m_expected_failures;
    if (iVar7 < 1) goto LAB_0011ac69;
    if ((this->super_CurrentTestCaseStats).numAssertsFailedCurrentTest == iVar7) {
      uVar5 = uVar3 | 0x100;
    }
    else {
      uVar5 = uVar3 | 0x80;
    }
  }
  else {
    uVar5 = uVar3 | 0x200;
  }
  (this->super_CurrentTestCaseStats).failure_flags = uVar5;
LAB_0011ac69:
  uVar3 = (this->super_CurrentTestCaseStats).failure_flags;
  bVar8 = (uVar3 & 0x340) != 0;
  (this->super_CurrentTestCaseStats).testCaseSuccess = uVar3 == 0 || bVar8;
  if (uVar3 != 0 && !bVar8) {
    puVar2 = &(this->super_TestRunStats).numTestCasesFailed;
    *puVar2 = *puVar2 + 1;
  }
  return;
}

Assistant:

void finalizeTestCaseData() {
            seconds = timer.getElapsedSeconds();

            // update the non-atomic counters
            numAsserts += numAssertsCurrentTest_atomic;
            numAssertsFailed += numAssertsFailedCurrentTest_atomic;
            numAssertsCurrentTest       = numAssertsCurrentTest_atomic;
            numAssertsFailedCurrentTest = numAssertsFailedCurrentTest_atomic;

            if(numAssertsFailedCurrentTest)
                failure_flags |= TestCaseFailureReason::AssertFailure;

            if(Approx(currentTest->m_timeout).epsilon(DBL_EPSILON) != 0 &&
               Approx(seconds).epsilon(DBL_EPSILON) > currentTest->m_timeout)
                failure_flags |= TestCaseFailureReason::Timeout;

            if(currentTest->m_should_fail) {
                if(failure_flags) {
                    failure_flags |= TestCaseFailureReason::ShouldHaveFailedAndDid;
                } else {
                    failure_flags |= TestCaseFailureReason::ShouldHaveFailedButDidnt;
                }
            } else if(failure_flags && currentTest->m_may_fail) {
                failure_flags |= TestCaseFailureReason::CouldHaveFailedAndDid;
            } else if(currentTest->m_expected_failures > 0) {
                if(numAssertsFailedCurrentTest == currentTest->m_expected_failures) {
                    failure_flags |= TestCaseFailureReason::FailedExactlyNumTimes;
                } else {
                    failure_flags |= TestCaseFailureReason::DidntFailExactlyNumTimes;
                }
            }

            bool ok_to_fail = (TestCaseFailureReason::ShouldHaveFailedAndDid & failure_flags) ||
                              (TestCaseFailureReason::CouldHaveFailedAndDid & failure_flags) ||
                              (TestCaseFailureReason::FailedExactlyNumTimes & failure_flags);

            // if any subcase has failed - the whole test case has failed
            testCaseSuccess = !(failure_flags && !ok_to_fail);
            if(!testCaseSuccess)
                numTestCasesFailed++;
        }